

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyParser.h
# Opt level: O0

float Assimp::PLY::PropertyInstance::ConvertTo<float>(ValueUnion v,EDataType eType)

{
  int iStack_18;
  EDataType eType_local;
  ValueUnion v_local;
  
  iStack_18 = v.iInt;
  switch(eType) {
  case EDT_Char:
  case EDT_Short:
  case EDT_Int:
    v_local._4_4_ = (undefined4)iStack_18;
    break;
  case EDT_UChar:
  case EDT_UShort:
  case EDT_UInt:
    v_local._4_4_ = (undefined4)((ulong)v & 0xffffffff);
    break;
  case EDT_Float:
    v_local._4_4_ = iStack_18;
    break;
  case EDT_Double:
    v_local._4_4_ = (undefined4)v.fDouble;
    break;
  default:
    v_local._4_4_ = 0;
  }
  return v_local._4_4_;
}

Assistant:

inline TYPE PLY::PropertyInstance::ConvertTo(
    PLY::PropertyInstance::ValueUnion v, PLY::EDataType eType)
{
    switch (eType)
    {
    case EDT_Float:
        return (TYPE)v.fFloat;
    case EDT_Double:
        return (TYPE)v.fDouble;

    case EDT_UInt:
    case EDT_UShort:
    case EDT_UChar:
        return (TYPE)v.iUInt;

    case EDT_Int:
    case EDT_Short:
    case EDT_Char:
        return (TYPE)v.iInt;
    default: ;
    };
    return (TYPE)0;
}